

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_access_ghost_element_ptr(Integer g_a,void *ptr,Integer *subscript,Integer *ld)

{
  short sVar1;
  short sVar2;
  long *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_2;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_1;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d;
  Integer me;
  Integer tmp_sub [7];
  Integer i;
  Integer handle;
  char *lptr;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1ec;
  int local_1e8 [7];
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8 [10];
  int local_190;
  int local_18c;
  long local_188;
  long local_180;
  long local_178;
  Integer local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  Integer local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118 [8];
  long local_d8 [7];
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  Integer local_80;
  long alStack_78 [8];
  long local_38;
  long local_30;
  long *local_20;
  long local_18;
  undefined8 *local_10;
  
  local_30 = in_RDI + 1000;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_80 = pnga_nodeid();
  for (local_38 = 0; local_38 < GA[local_30].ndim; local_38 = local_38 + 1) {
    alStack_78[local_38] = *(long *)(local_18 + local_38 * 8) + -1;
  }
  local_90 = 1;
  local_98 = (long)(GA[local_30].ndim + -1);
  local_a0 = 0;
  if (GA[local_30].distr_type == 0) {
    if (GA[local_30].num_rstrctd == 0) {
      local_140 = (long)GA[local_30].ndim;
      local_148 = 0;
      local_128 = 1;
      for (local_130 = 0; local_130 < local_140; local_130 = local_130 + 1) {
        local_128 = GA[local_30].nblock[local_130] * local_128;
      }
      if ((local_128 + -1 < local_80) || (local_80 < 0)) {
        for (local_130 = 0; local_130 < local_140; local_130 = local_130 + 1) {
          local_d8[local_130] = 0;
          local_118[local_130] = -1;
        }
      }
      else {
        local_138 = local_80;
        for (local_130 = 0; local_130 < local_140; local_130 = local_130 + 1) {
          local_120 = local_138 % (long)GA[local_30].nblock[local_130];
          local_138 = local_138 / (long)GA[local_30].nblock[local_130];
          local_150 = local_120 + local_148;
          local_148 = GA[local_30].nblock[local_130] + local_148;
          local_d8[local_130] = GA[local_30].mapc[local_150];
          if (local_120 == GA[local_30].nblock[local_130] + -1) {
            local_118[local_130] = GA[local_30].dims[local_130];
          }
          else {
            local_118[local_130] = GA[local_30].mapc[local_150 + 1] + -1;
          }
        }
      }
    }
    else if (local_80 < GA[local_30].num_rstrctd) {
      local_178 = (long)GA[local_30].ndim;
      local_180 = 0;
      local_160 = 1;
      for (local_168 = 0; local_168 < local_178; local_168 = local_168 + 1) {
        local_160 = GA[local_30].nblock[local_168] * local_160;
      }
      if ((local_160 + -1 < local_80) || (local_80 < 0)) {
        for (local_168 = 0; local_168 < local_178; local_168 = local_168 + 1) {
          local_d8[local_168] = 0;
          local_118[local_168] = -1;
        }
      }
      else {
        local_170 = local_80;
        for (local_168 = 0; local_168 < local_178; local_168 = local_168 + 1) {
          local_158 = local_170 % (long)GA[local_30].nblock[local_168];
          local_170 = local_170 / (long)GA[local_30].nblock[local_168];
          local_188 = local_158 + local_180;
          local_180 = GA[local_30].nblock[local_168] + local_180;
          local_d8[local_168] = GA[local_30].mapc[local_188];
          if (local_158 == GA[local_30].nblock[local_168] + -1) {
            local_118[local_168] = GA[local_30].dims[local_168];
          }
          else {
            local_118[local_168] = GA[local_30].mapc[local_188 + 1] + -1;
          }
        }
      }
    }
    else {
      sVar1 = GA[local_30].ndim;
      local_190 = (int)sVar1;
      for (local_18c = 0; local_18c < sVar1; local_18c = local_18c + 1) {
        local_d8[local_18c] = 0;
        local_118[local_18c] = -1;
      }
    }
  }
  else {
    local_1f8 = (int)local_80;
    if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
       (GA[local_30].distr_type == 3)) {
      sVar1 = GA[local_30].ndim;
      local_1c0 = (int)sVar1;
      sVar2 = GA[local_30].ndim;
      local_1cc = (int)sVar2;
      local_1c4 = local_1f8;
      local_1b8[0] = (int)((long)local_1f8 % GA[local_30].num_blocks[0]);
      for (local_1c8 = 1; local_1c8 < sVar2; local_1c8 = local_1c8 + 1) {
        local_1c4 = (int)((long)(local_1c4 - local_1b8[local_1c8 + -1]) /
                         GA[local_30].num_blocks[local_1c8 + -1]);
        local_1b8[local_1c8] = (int)((long)local_1c4 % GA[local_30].num_blocks[local_1c8]);
      }
      for (local_1bc = 0; local_1bc < sVar1; local_1bc = local_1bc + 1) {
        local_d8[local_1bc] = (long)local_1b8[local_1bc] * GA[local_30].block_dims[local_1bc] + 1;
        local_118[local_1bc] = (long)(local_1b8[local_1bc] + 1) * GA[local_30].block_dims[local_1bc]
        ;
        if (GA[local_30].dims[local_1bc] < local_118[local_1bc]) {
          local_118[local_1bc] = GA[local_30].dims[local_1bc];
        }
      }
    }
    else if (GA[local_30].distr_type == 4) {
      sVar1 = GA[local_30].ndim;
      local_1f4 = 0;
      sVar2 = GA[local_30].ndim;
      local_1e8[0] = (int)((long)local_1f8 % GA[local_30].num_blocks[0]);
      for (local_1fc = 1; local_1fc < sVar2; local_1fc = local_1fc + 1) {
        local_1f8 = (int)((long)(local_1f8 - local_1e8[local_1fc + -1]) /
                         GA[local_30].num_blocks[local_1fc + -1]);
        local_1e8[local_1fc] = (int)((long)local_1f8 % GA[local_30].num_blocks[local_1fc]);
      }
      for (local_1ec = 0; local_1ec < sVar1; local_1ec = local_1ec + 1) {
        local_d8[local_1ec] = GA[local_30].mapc[local_1f4 + local_1e8[local_1ec]];
        if ((long)local_1e8[local_1ec] < GA[local_30].num_blocks[local_1ec] + -1) {
          local_118[local_1ec] = GA[local_30].mapc[local_1f4 + local_1e8[local_1ec] + 1] + -1;
        }
        else {
          local_118[local_1ec] = GA[local_30].dims[local_1ec];
        }
        local_1f4 = local_1f4 + (int)GA[local_30].num_blocks[local_1ec];
      }
    }
  }
  if (local_98 == 0) {
    *local_20 = (local_118[0] - local_d8[0]) + 1 + GA[local_30].width[0] * 2;
  }
  for (local_88 = 0; local_88 < local_98; local_88 = local_88 + 1) {
    local_a0 = alStack_78[local_88] * local_90 + local_a0;
    local_20[local_88] =
         (local_118[local_88] - local_d8[local_88]) + 1 + GA[local_30].width[local_88] * 2;
    local_90 = local_20[local_88] * local_90;
  }
  *local_10 = GA[local_30].ptr[local_80] +
              (alStack_78[local_98] * local_90 + local_a0) * (long)GA[local_30].elemsize;
  return;
}

Assistant:

void pnga_access_ghost_element_ptr(Integer g_a, void *ptr, 
                        Integer subscript[], Integer ld[]) 
{ 
  char *lptr; 
  Integer  handle = GA_OFFSET + g_a; 
  Integer i; 
  Integer tmp_sub[MAXDIM]; 
  Integer me = pnga_nodeid(); 
  /* Indices conform to Fortran convention. Shift them down 1 so that 
     gam_LocationWithGhosts works. */ 
  for (i=0; i<GA[handle].ndim; i++) tmp_sub[i] = subscript[i] - 1; 
  gam_LocationWithGhosts(me, handle, tmp_sub, &lptr, ld); 
 
  *(char**)ptr = lptr; 
}